

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TDeletingArray
          (TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this)

{
  FOptionMenuItem *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Count;
      uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar2];
    if (pFVar1 != (FOptionMenuItem *)0x0) {
      (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[1])();
    }
  }
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TArray
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}